

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameTableTest(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  ulong uVar1;
  sqlite3_xauth p_Var2;
  int iVar3;
  int iVar4;
  sqlite3 *db_00;
  uchar *zDb_00;
  uchar *zSql;
  uchar *zWhen_00;
  int i2;
  int i1;
  NameContext sNC;
  undefined1 local_200 [4];
  int flags;
  Parse sParse;
  int rc;
  sqlite3_xauth xAuth;
  int bNoDQS;
  char *zWhen;
  int isLegacy;
  int bTemp;
  char *zInput;
  char *zDb;
  sqlite3 *db;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db_00 = sqlite3_context_db_handle(context);
  zDb_00 = sqlite3_value_text(*argv);
  zSql = sqlite3_value_text(argv[1]);
  iVar3 = sqlite3_value_int(argv[4]);
  uVar1 = db_00->flags;
  zWhen_00 = sqlite3_value_text(argv[5]);
  iVar4 = sqlite3_value_int(argv[6]);
  p_Var2 = db_00->xAuth;
  db_00->xAuth = (sqlite3_xauth)0x0;
  if ((zDb_00 != (uchar *)0x0) && (zSql != (uchar *)0x0)) {
    sNC.pWinSelect._4_4_ = (uint)db_00->flags;
    if (iVar4 != 0) {
      db_00->flags = db_00->flags & 0xffffffff9fffffff;
    }
    sParse.pRename._4_4_ =
         renameParseSql((Parse *)local_200,(char *)zDb_00,db_00,(char *)zSql,iVar3);
    db_00->flags = (long)(int)(sNC.pWinSelect._4_4_ & 0x60000000) | db_00->flags;
    if (sParse.pRename._4_4_ == 0) {
      if ((((uVar1 & 0x4000000) == 0) && (sParse.zTail != (char *)0x0)) &&
         (sParse.zTail[0x3f] == '\x02')) {
        memset(&i2,0,0x38);
        _i2 = (Parse *)local_200;
        sqlite3SelectPrep((Parse *)local_200,*(Select **)(sParse.zTail + 0x40),(NameContext *)&i2);
        if (sParse.nRangeReg != 0) {
          sParse.pRename._4_4_ = (int)sParse.pVdbe;
        }
      }
      else if (sParse.pNewIndex != (Index *)0x0) {
        if ((uVar1 & 0x4000000) == 0) {
          sParse.pRename._4_4_ = renameResolveTrigger((Parse *)local_200);
        }
        if (sParse.pRename._4_4_ == 0) {
          iVar3 = sqlite3SchemaToIndex(db_00,(sParse.pNewIndex)->pSchema);
          iVar4 = sqlite3FindDbName(db_00,(char *)zDb_00);
          if (iVar3 == iVar4) {
            sqlite3_result_int(context,1);
          }
        }
      }
    }
    if (((sParse.pRename._4_4_ != 0) && (zWhen_00 != (uchar *)0x0)) &&
       (iVar3 = sqlite3WritableSchema(db_00), iVar3 == 0)) {
      renameColumnParseError(context,(char *)zWhen_00,argv[2],argv[3],(Parse *)local_200);
    }
    renameParseCleanup((Parse *)local_200);
  }
  db_00->xAuth = p_Var2;
  return;
}

Assistant:

static void renameTableTest(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);
  int bTemp = sqlite3_value_int(argv[4]);
  int isLegacy = (db->flags & SQLITE_LegacyAlter);
  char const *zWhen = (const char*)sqlite3_value_text(argv[5]);
  int bNoDQS = sqlite3_value_int(argv[6]);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);

  if( zDb && zInput ){
    int rc;
    Parse sParse;
    int flags = db->flags;
    if( bNoDQS ) db->flags &= ~(SQLITE_DqsDML|SQLITE_DqsDDL);
    rc = renameParseSql(&sParse, zDb, db, zInput, bTemp);
    db->flags |= (flags & (SQLITE_DqsDML|SQLITE_DqsDDL));
    if( rc==SQLITE_OK ){
      if( isLegacy==0 && sParse.pNewTable && IsView(sParse.pNewTable) ){
        NameContext sNC;
        memset(&sNC, 0, sizeof(sNC));
        sNC.pParse = &sParse;
        sqlite3SelectPrep(&sParse, sParse.pNewTable->u.view.pSelect, &sNC);
        if( sParse.nErr ) rc = sParse.rc;
      }

      else if( sParse.pNewTrigger ){
        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse);
        }
        if( rc==SQLITE_OK ){
          int i1 = sqlite3SchemaToIndex(db, sParse.pNewTrigger->pTabSchema);
          int i2 = sqlite3FindDbName(db, zDb);
          if( i1==i2 ){
            /* Handle output case B */
            sqlite3_result_int(context, 1);
          }
        }
      }
    }

    if( rc!=SQLITE_OK && zWhen && !sqlite3WritableSchema(db) ){
      /* Output case A */
      renameColumnParseError(context, zWhen, argv[2], argv[3],&sParse);
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
}